

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtCompoundCollisionAlgorithm::processCollision
          (cbtCompoundCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  float fVar4;
  cbtScalar cVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  ulong uVar12;
  cbtCollisionShape *pcVar13;
  cbtDbvt *this_00;
  cbtPersistentManifold **ppcVar14;
  cbtCollisionAlgorithm *pcVar15;
  cbtPersistentManifold *this_01;
  cbtCollisionObject *pcVar16;
  cbtTransform *pcVar17;
  void *pvVar18;
  cbtDispatcher *pcVar19;
  undefined1 auVar20 [16];
  cbtCollisionObjectWrapper *pcVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  cbtCollisionObjectWrapper *pcVar25;
  cbtCollisionObject *pcVar26;
  long lVar27;
  cbtCollisionObject *pcVar28;
  int curSize;
  int iVar29;
  int i_1;
  ulong uVar30;
  int i;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  cbtVector3 aabbMin1;
  cbtVector3 aabbMax0;
  cbtVector3 aabbMax1;
  cbtCompoundLeafCallback callback;
  cbtDbvtVolume bounds;
  float local_130;
  float fStack_12c;
  float fStack_128;
  cbtScalar cStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  cbtScalar cStack_114;
  cbtManifoldArray *local_110;
  float local_108;
  float local_104;
  float local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined1 local_c8 [16];
  cbtCompoundLeafCallback local_b8;
  undefined1 local_78 [8];
  cbtScalar cStack_70;
  cbtScalar local_68;
  float fStack_64;
  cbtScalar acStack_60 [2];
  undefined4 local_58;
  float local_54;
  undefined4 local_50;
  float local_48;
  uint local_44;
  float local_40;
  
  pcVar25 = body1Wrap;
  pcVar21 = body0Wrap;
  if (this->m_isSwapped != false) {
    pcVar25 = body0Wrap;
    pcVar21 = body1Wrap;
  }
  pcVar13 = pcVar21->m_shape;
  if (pcVar13[3].m_shapeType != this->m_compoundShapeRevision) {
    removeChildAlgorithms(this);
    preallocateChildAlgorithms(this,body0Wrap,body1Wrap);
    this->m_compoundShapeRevision = pcVar13[3].m_shapeType;
  }
  uVar24 = (this->m_childCollisionAlgorithms).m_size;
  if (uVar24 != 0) {
    this_00 = (cbtDbvt *)pcVar13[3]._vptr_cbtCollisionShape;
    local_b8.m_childCollisionAlgorithms = (this->m_childCollisionAlgorithms).m_data;
    local_b8.m_sharedManifold = this->m_sharedManifold;
    local_b8.m_dispatcher =
         (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.m_dispatcher;
    local_b8.super_ICollide._vptr_ICollide = (_func_int **)&PTR__ICollide_00b48438;
    lVar31 = (long)(this->manifoldArray).m_size;
    local_b8.m_compoundColObjWrap = pcVar21;
    local_b8.m_otherObjWrap = pcVar25;
    local_b8.m_dispatchInfo = dispatchInfo;
    local_b8.m_resultOut = resultOut;
    if (lVar31 < 0) {
      if ((this->manifoldArray).m_capacity < 0) {
        ppcVar14 = (this->manifoldArray).m_data;
        if ((ppcVar14 != (cbtPersistentManifold **)0x0) &&
           ((this->manifoldArray).m_ownsMemory == true)) {
          cbtAlignedFreeInternal(ppcVar14);
        }
        (this->manifoldArray).m_ownsMemory = true;
        (this->manifoldArray).m_data = (cbtPersistentManifold **)0x0;
        (this->manifoldArray).m_capacity = 0;
      }
      do {
        (this->manifoldArray).m_data[lVar31] = (cbtPersistentManifold *)0x0;
        lVar31 = lVar31 + 1;
      } while (lVar31 != 0);
      uVar24 = (this->m_childCollisionAlgorithms).m_size;
    }
    (this->manifoldArray).m_size = 0;
    if (0 < (int)uVar24) {
      local_110 = &this->manifoldArray;
      lVar31 = 0;
      do {
        pcVar15 = (this->m_childCollisionAlgorithms).m_data[lVar31];
        if (pcVar15 != (cbtCollisionAlgorithm *)0x0) {
          (*pcVar15->_vptr_cbtCollisionAlgorithm[4])(pcVar15,local_110);
          iVar29 = (this->manifoldArray).m_size;
          if (0 < iVar29) {
            lVar27 = 0;
            do {
              this_01 = (this->manifoldArray).m_data[lVar27];
              if (this_01->m_cachedPoints != 0) {
                resultOut->m_manifoldPtr = this_01;
                pcVar28 = resultOut->m_body0Wrap->m_collisionObject;
                pcVar16 = resultOut->m_body1Wrap->m_collisionObject;
                pcVar26 = pcVar16;
                if (this_01->m_body0 != pcVar28) {
                  pcVar26 = pcVar28;
                  pcVar28 = pcVar16;
                }
                cbtPersistentManifold::refreshContactPoints
                          (this_01,&pcVar28->m_worldTransform,&pcVar26->m_worldTransform);
                resultOut->m_manifoldPtr = (cbtPersistentManifold *)0x0;
                iVar29 = (this->manifoldArray).m_size;
              }
              lVar27 = lVar27 + 1;
            } while (lVar27 < iVar29);
          }
          if (iVar29 < 0) {
            if ((this->manifoldArray).m_capacity < 0) {
              ppcVar14 = (this->manifoldArray).m_data;
              if ((ppcVar14 != (cbtPersistentManifold **)0x0) &&
                 ((this->manifoldArray).m_ownsMemory == true)) {
                cbtAlignedFreeInternal(ppcVar14);
              }
              (this->manifoldArray).m_ownsMemory = true;
              (this->manifoldArray).m_data = (cbtPersistentManifold **)0x0;
              (this->manifoldArray).m_capacity = 0;
            }
            lVar27 = (long)iVar29;
            do {
              (this->manifoldArray).m_data[lVar27] = (cbtPersistentManifold *)0x0;
              lVar27 = lVar27 + 1;
            } while (lVar27 != 0);
          }
          (this->manifoldArray).m_size = 0;
          uVar24 = (this->m_childCollisionAlgorithms).m_size;
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 < (int)uVar24);
    }
    if (this_00 == (cbtDbvt *)0x0) {
      if (0 < (int)uVar24) {
        lVar31 = 0x40;
        uVar30 = 0;
        do {
          cbtCompoundLeafCallback::ProcessChildShape
                    (&local_b8,*(cbtCollisionShape **)((long)pcVar13[1].m_userPointer + lVar31),
                     (int)uVar30);
          uVar30 = uVar30 + 1;
          lVar31 = lVar31 + 0x58;
        } while (uVar24 != uVar30);
      }
    }
    else {
      _local_78 = stack0xffffffffffffff8c;
      cbtTransform::inverse(pcVar21->m_worldTransform);
      auVar33._4_4_ = local_78._4_4_;
      auVar33._0_4_ = local_78._4_4_;
      auVar33._8_4_ = local_78._4_4_;
      auVar33._12_4_ = local_78._4_4_;
      auVar43._4_4_ = fStack_64;
      auVar43._0_4_ = fStack_64;
      auVar43._8_4_ = fStack_64;
      auVar43._12_4_ = fStack_64;
      auVar50._4_4_ = local_54;
      auVar50._0_4_ = local_54;
      auVar50._8_4_ = local_54;
      auVar50._12_4_ = local_54;
      auVar40._4_4_ = local_78._0_4_;
      auVar40._0_4_ = local_78._0_4_;
      auVar40._8_4_ = local_78._0_4_;
      auVar40._12_4_ = local_78._0_4_;
      auVar46._4_4_ = local_68;
      auVar46._0_4_ = local_68;
      auVar46._8_4_ = local_68;
      auVar46._12_4_ = local_68;
      auVar52._4_4_ = local_58;
      auVar52._0_4_ = local_58;
      auVar52._8_4_ = local_58;
      auVar52._12_4_ = local_58;
      auVar41._4_4_ = cStack_70;
      auVar41._0_4_ = cStack_70;
      auVar41._8_4_ = cStack_70;
      auVar41._12_4_ = cStack_70;
      auVar48._4_4_ = acStack_60[0];
      auVar48._0_4_ = acStack_60[0];
      auVar48._8_4_ = acStack_60[0];
      auVar48._12_4_ = acStack_60[0];
      pcVar17 = pcVar25->m_worldTransform;
      fVar1 = (pcVar17->m_basis).m_el[1].m_floats[2];
      cVar2 = (pcVar17->m_basis).m_el[0].m_floats[2];
      cVar3 = (pcVar17->m_basis).m_el[2].m_floats[2];
      fVar4 = (pcVar17->m_origin).m_floats[1];
      cVar5 = (pcVar17->m_origin).m_floats[2];
      auVar32 = vmulss_avx512f(auVar43,ZEXT416((uint)fVar4));
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)((float)local_78._4_4_ * fVar1)),ZEXT416((uint)cVar2),
                                auVar40);
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fStack_64)),ZEXT416((uint)cVar2),auVar46);
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(local_54 * fVar1)),auVar52,ZEXT416((uint)cVar2));
      auVar36._4_4_ = local_50;
      auVar36._0_4_ = local_50;
      auVar36._8_4_ = local_50;
      auVar36._12_4_ = local_50;
      auVar58 = vfmadd231ss_fma(auVar35,ZEXT416((uint)cVar3),auVar41);
      auVar20 = vfmadd231ss_fma(auVar34,ZEXT416((uint)cVar3),auVar48);
      auVar37 = vfmadd231ss_fma(auVar37,auVar36,ZEXT416((uint)cVar3));
      cVar2 = (pcVar17->m_origin).m_floats[0];
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_78._4_4_)),ZEXT416((uint)cVar2),
                                auVar40);
      auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)cVar2),auVar46);
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(local_54 * fVar4)),auVar52,ZEXT416((uint)cVar2));
      auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)cVar5),auVar41);
      auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)cVar5),auVar48);
      auVar32 = vaddss_avx512f(auVar32,ZEXT416(local_44));
      auVar34 = vfmadd231ss_fma(auVar34,auVar36,ZEXT416((uint)cVar5));
      uVar30 = *(ulong *)(pcVar17->m_basis).m_el[1].m_floats;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(ulong *)(pcVar17->m_basis).m_el[2].m_floats;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar30;
      auVar33 = vmulps_avx512vl(auVar33,auVar57);
      auVar35 = vinsertps_avx(ZEXT416((uint)(auVar35._0_4_ + local_48)),auVar32,0x10);
      local_c8 = vinsertps_avx(auVar35,ZEXT416((uint)(auVar34._0_4_ + local_40)),0x28);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(pcVar17->m_basis).m_el[0].m_floats;
      auVar35 = vfmadd231ps_fma(auVar33,auVar32,auVar40);
      auVar35 = vfmadd231ps_fma(auVar35,auVar55,auVar41);
      auVar34 = vmulps_avx512vl(auVar57,auVar43);
      auVar34 = vfmadd231ps_fma(auVar34,auVar32,auVar46);
      local_f8 = vmovlps_avx(auVar35);
      local_f0 = auVar58._0_4_;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar30;
      auVar35 = vmulps_avx512vl(auVar58,auVar50);
      local_ec = 0;
      auVar35 = vfmadd231ps_fma(auVar35,auVar32,auVar52);
      auVar34 = vfmadd231ps_fma(auVar34,auVar55,auVar48);
      auVar35 = vfmadd231ps_fma(auVar35,auVar55,auVar36);
      local_e8 = vmovlps_avx(auVar34);
      local_e0 = auVar20._0_4_;
      local_dc = 0;
      local_d8 = vmovlps_avx(auVar35);
      local_d0 = auVar37._0_4_;
      local_cc = 0;
      (*pcVar25->m_shape->_vptr_cbtCollisionShape[2])
                (pcVar25->m_shape,&local_f8,&local_120,&local_130);
      fVar1 = resultOut->m_closestPointDistanceThreshold;
      auVar35._4_4_ = fVar1;
      auVar35._0_4_ = fVar1;
      auVar35._8_4_ = fVar1;
      auVar35._12_4_ = fVar1;
      auVar34._4_4_ = fStack_11c;
      auVar34._0_4_ = local_120;
      auVar34._8_8_ = 0;
      auVar35 = vsubps_avx(auVar34,auVar35);
      uVar11 = vmovlps_avx(auVar35);
      local_120 = (float)uVar11;
      fStack_11c = (float)((ulong)uVar11 >> 0x20);
      fStack_118 = fStack_118 - fVar1;
      cStack_70 = fStack_118;
      local_78._0_4_ = (int)uVar11;
      local_78._4_4_ = (int)((ulong)uVar11 >> 0x20);
      unique0x10000273 = cStack_114;
      auVar37._0_4_ = fVar1 + (float)_local_130;
      auVar37._4_4_ = fVar1 + SUB84(_local_130,4);
      auVar37._8_4_ = fVar1 + 0.0;
      auVar37._12_4_ = fVar1 + 0.0;
      _local_130 = vmovlps_avx(auVar37);
      fStack_128 = fVar1 + fStack_128;
      acStack_60[1] = cStack_124;
      acStack_60[0] = fStack_128;
      _local_68 = _local_130;
      cbtDbvt::collideTVNoStackAlloc
                (this_00,this_00->m_root,(cbtDbvtVolume *)local_78,&this->stack2,
                 &local_b8.super_ICollide);
    }
    uVar24 = (this->m_childCollisionAlgorithms).m_size;
    lVar31 = (long)(this->manifoldArray).m_size;
    if (lVar31 < 0) {
      if ((this->manifoldArray).m_capacity < 0) {
        ppcVar14 = (this->manifoldArray).m_data;
        if ((ppcVar14 != (cbtPersistentManifold **)0x0) &&
           ((this->manifoldArray).m_ownsMemory == true)) {
          cbtAlignedFreeInternal(ppcVar14);
        }
        (this->manifoldArray).m_ownsMemory = true;
        (this->manifoldArray).m_data = (cbtPersistentManifold **)0x0;
        (this->manifoldArray).m_capacity = 0;
      }
      do {
        (this->manifoldArray).m_data[lVar31] = (cbtPersistentManifold *)0x0;
        lVar31 = lVar31 + 1;
      } while (lVar31 != 0);
    }
    (this->manifoldArray).m_size = 0;
    if (0 < (int)uVar24) {
      lVar31 = 0x40;
      uVar30 = 0;
      do {
        if ((this->m_childCollisionAlgorithms).m_data[uVar30] != (cbtCollisionAlgorithm *)0x0) {
          pvVar18 = pcVar13[1].m_userPointer;
          pcVar17 = pcVar21->m_worldTransform;
          fVar1 = *(float *)((long)pvVar18 + lVar31 + -0x28);
          uVar6 = *(uint *)((long)pvVar18 + lVar31 + -0x38);
          uVar7 = *(uint *)((long)pvVar18 + lVar31 + -0x18);
          uVar8 = *(uint *)((long)pvVar18 + lVar31 + -8);
          fVar4 = (pcVar17->m_basis).m_el[0].m_floats[1];
          auVar38._4_4_ = fVar4;
          auVar38._0_4_ = fVar4;
          auVar38._8_4_ = fVar4;
          auVar38._12_4_ = fVar4;
          fVar9 = (pcVar17->m_basis).m_el[1].m_floats[1];
          auVar45._4_4_ = fVar9;
          auVar45._0_4_ = fVar9;
          auVar45._8_4_ = fVar9;
          auVar45._12_4_ = fVar9;
          fVar10 = (pcVar17->m_basis).m_el[2].m_floats[1];
          auVar51._4_4_ = fVar10;
          auVar51._0_4_ = fVar10;
          auVar51._8_4_ = fVar10;
          auVar51._12_4_ = fVar10;
          cVar2 = (pcVar17->m_basis).m_el[0].m_floats[0];
          auVar39._4_4_ = cVar2;
          auVar39._0_4_ = cVar2;
          auVar39._8_4_ = cVar2;
          auVar39._12_4_ = cVar2;
          cVar2 = (pcVar17->m_basis).m_el[1].m_floats[0];
          auVar47._4_4_ = cVar2;
          auVar47._0_4_ = cVar2;
          auVar47._8_4_ = cVar2;
          auVar47._12_4_ = cVar2;
          cVar2 = (pcVar17->m_basis).m_el[2].m_floats[0];
          auVar53._4_4_ = cVar2;
          auVar53._0_4_ = cVar2;
          auVar53._8_4_ = cVar2;
          auVar53._12_4_ = cVar2;
          cVar2 = (pcVar17->m_basis).m_el[0].m_floats[2];
          auVar42._4_4_ = cVar2;
          auVar42._0_4_ = cVar2;
          auVar42._8_4_ = cVar2;
          auVar42._12_4_ = cVar2;
          cVar2 = (pcVar17->m_basis).m_el[1].m_floats[2];
          auVar49._4_4_ = cVar2;
          auVar49._0_4_ = cVar2;
          auVar49._8_4_ = cVar2;
          auVar49._12_4_ = cVar2;
          cVar2 = (pcVar17->m_basis).m_el[2].m_floats[2];
          auVar54._4_4_ = cVar2;
          auVar54._0_4_ = cVar2;
          auVar54._8_4_ = cVar2;
          auVar54._12_4_ = cVar2;
          auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar1)),ZEXT416(uVar6),auVar39);
          auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar1)),ZEXT416(uVar6),auVar47);
          auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar1)),auVar53,ZEXT416(uVar6));
          uVar6 = *(uint *)((long)pvVar18 + lVar31 + -0x10);
          auVar58 = vfmadd231ss_fma(auVar35,ZEXT416(uVar7),auVar42);
          auVar20 = vfmadd231ss_fma(auVar34,ZEXT416(uVar7),auVar49);
          auVar37 = vfmadd231ss_fma(auVar37,auVar54,ZEXT416(uVar7));
          fVar1 = *(float *)((long)pvVar18 + lVar31 + -0xc);
          auVar34 = vmulss_avx512f(auVar45,ZEXT416((uint)fVar1));
          auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar1)),ZEXT416(uVar6),auVar39);
          auVar32 = vfmadd231ss_avx512f(auVar34,ZEXT416(uVar6),auVar47);
          auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar1)),auVar53,ZEXT416(uVar6));
          auVar35 = vfmadd231ss_fma(auVar35,ZEXT416(uVar8),auVar42);
          auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416(uVar8),auVar49);
          auVar32 = vaddss_avx512f(auVar32,ZEXT416((uint)(pcVar17->m_origin).m_floats[1]));
          auVar34 = vfmadd231ss_fma(auVar34,auVar54,ZEXT416(uVar8));
          uVar12 = *(ulong *)((long)pvVar18 + lVar31 + -0x30);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)((long)pvVar18 + lVar31 + -0x20);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar12;
          auVar33 = vmulps_avx512vl(auVar38,auVar59);
          auVar35 = vinsertps_avx(ZEXT416((uint)(auVar35._0_4_ + (pcVar17->m_origin).m_floats[0])),
                                  auVar32,0x10);
          local_c8 = vinsertps_avx(auVar35,ZEXT416((uint)(auVar34._0_4_ +
                                                         (pcVar17->m_origin).m_floats[2])),0x28);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)((long)pvVar18 + lVar31 + -0x40);
          auVar35 = vfmadd231ps_fma(auVar33,auVar44,auVar39);
          auVar35 = vfmadd231ps_fma(auVar35,auVar56,auVar42);
          auVar34 = vmulps_avx512vl(auVar45,auVar59);
          auVar34 = vfmadd231ps_fma(auVar34,auVar44,auVar47);
          local_f8 = vmovlps_avx(auVar35);
          local_f0 = auVar58._0_4_;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = uVar12;
          auVar35 = vmulps_avx512vl(auVar51,auVar60);
          local_ec = 0;
          auVar35 = vfmadd231ps_fma(auVar35,auVar44,auVar53);
          auVar34 = vfmadd231ps_fma(auVar34,auVar56,auVar49);
          auVar35 = vfmadd231ps_fma(auVar35,auVar56,auVar54);
          local_e8 = vmovlps_avx(auVar34);
          local_e0 = auVar20._0_4_;
          local_dc = 0;
          local_d8 = vmovlps_avx(auVar35);
          local_d0 = auVar37._0_4_;
          local_cc = 0;
          (**(code **)(**(long **)((long)pvVar18 + lVar31) + 0x10))
                    (*(long **)((long)pvVar18 + lVar31),&local_f8,local_78,&local_120);
          (*pcVar25->m_shape->_vptr_cbtCollisionShape[2])
                    (pcVar25->m_shape,pcVar25->m_worldTransform,&local_130,&local_108);
          bVar22 = 1;
          if ((float)local_78._0_4_ <= local_108) {
            bVar22 = 1;
            if (local_130 <= local_120) {
              bVar22 = 0;
            }
          }
          bVar23 = 1;
          if ((cStack_70 <= local_100) && (fStack_128 <= fStack_118)) {
            bVar23 = bVar22;
          }
          if ((local_104 < (float)local_78._4_4_) || (!(bool)(~bVar23 & fStack_12c <= fStack_11c)))
          {
            (**(this->m_childCollisionAlgorithms).m_data[uVar30]->_vptr_cbtCollisionAlgorithm)();
            pcVar19 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
                      m_dispatcher;
            (*pcVar19->_vptr_cbtDispatcher[0xf])
                      (pcVar19,(this->m_childCollisionAlgorithms).m_data[uVar30]);
            (this->m_childCollisionAlgorithms).m_data[uVar30] = (cbtCollisionAlgorithm *)0x0;
          }
        }
        uVar30 = uVar30 + 1;
        lVar31 = lVar31 + 0x58;
      } while (uVar24 != uVar30);
    }
  }
  return;
}

Assistant:

void cbtCompoundCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	const cbtCollisionObjectWrapper* colObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* otherObjWrap = m_isSwapped ? body0Wrap : body1Wrap;

	cbtAssert(colObjWrap->getCollisionShape()->isCompound());
	const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(colObjWrap->getCollisionShape());

	///cbtCompoundShape might have changed:
	////make sure the internal child collision algorithm caches are still valid
	if (compoundShape->getUpdateRevision() != m_compoundShapeRevision)
	{
		///clear and update all
		removeChildAlgorithms();

		preallocateChildAlgorithms(body0Wrap, body1Wrap);
		m_compoundShapeRevision = compoundShape->getUpdateRevision();
	}

	if (m_childCollisionAlgorithms.size() == 0)
		return;

	const cbtDbvt* tree = compoundShape->getDynamicAabbTree();
	//use a dynamic aabb tree to cull potential child-overlaps
	cbtCompoundLeafCallback callback(colObjWrap, otherObjWrap, m_dispatcher, dispatchInfo, resultOut, &m_childCollisionAlgorithms[0], m_sharedManifold);

	///we need to refresh all contact manifolds
	///note that we should actually recursively traverse all children, cbtCompoundShape can nested more then 1 level deep
	///so we should add a 'refreshManifolds' in the cbtCollisionAlgorithm
	{
		int i;
		manifoldArray.resize(0);
		for (i = 0; i < m_childCollisionAlgorithms.size(); i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				m_childCollisionAlgorithms[i]->getAllContactManifolds(manifoldArray);
				for (int m = 0; m < manifoldArray.size(); m++)
				{
					if (manifoldArray[m]->getNumContacts())
					{
						resultOut->setPersistentManifold(manifoldArray[m]);
						resultOut->refreshContactPoints();
						resultOut->setPersistentManifold(0);  //??necessary?
					}
				}
				manifoldArray.resize(0);
			}
		}
	}

	if (tree)
	{
		cbtVector3 localAabbMin, localAabbMax;
		cbtTransform otherInCompoundSpace;
		otherInCompoundSpace = colObjWrap->getWorldTransform().inverse() * otherObjWrap->getWorldTransform();
		otherObjWrap->getCollisionShape()->getAabb(otherInCompoundSpace, localAabbMin, localAabbMax);
		cbtVector3 extraExtends(resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold);
		localAabbMin -= extraExtends;
		localAabbMax += extraExtends;

		const ATTRIBUTE_ALIGNED16(cbtDbvtVolume) bounds = cbtDbvtVolume::FromMM(localAabbMin, localAabbMax);
		//process all children, that overlap with  the given AABB bounds
		tree->collideTVNoStackAlloc(tree->m_root, bounds, stack2, callback);
	}
	else
	{
		//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		for (i = 0; i < numChildren; i++)
		{
			callback.ProcessChildShape(compoundShape->getChildShape(i), i);
		}
	}

	{
		//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		manifoldArray.resize(0);
		const cbtCollisionShape* childShape = 0;
		cbtTransform orgTrans;

		cbtTransform newChildWorldTrans;
		cbtVector3 aabbMin0, aabbMax0, aabbMin1, aabbMax1;

		for (i = 0; i < numChildren; i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				childShape = compoundShape->getChildShape(i);
				//if not longer overlapping, remove the algorithm
				orgTrans = colObjWrap->getWorldTransform();

				const cbtTransform& childTrans = compoundShape->getChildTransform(i);
				newChildWorldTrans = orgTrans * childTrans;

				//perform an AABB check first
				childShape->getAabb(newChildWorldTrans, aabbMin0, aabbMax0);
				otherObjWrap->getCollisionShape()->getAabb(otherObjWrap->getWorldTransform(), aabbMin1, aabbMax1);

				if (!TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
				{
					m_childCollisionAlgorithms[i]->~cbtCollisionAlgorithm();
					m_dispatcher->freeCollisionAlgorithm(m_childCollisionAlgorithms[i]);
					m_childCollisionAlgorithms[i] = 0;
				}
			}
		}
	}
}